

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O2

int AF_DThinkerIterator_Reinit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DObject *this;
  bool bVar1;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (DObject *)(param->field_0).field_1.a;
    bVar1 = DObject::IsKindOf(this,DThinkerIterator::RegistrationInfo.MyClass);
    if (bVar1) {
      FThinkerIterator::Reinit((FThinkerIterator *)(this + 1));
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DThinkerIterator))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x2de,
                "int AF_DThinkerIterator_Reinit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DThinkerIterator, Reinit)
{
	PARAM_SELF_PROLOGUE(DThinkerIterator);
	self->Reinit();
	return 0;
}